

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shrink.cpp
# Opt level: O2

uint __thiscall
CaDiCaL::Internal::shrink_along_reason
          (Internal *this,int uip,int blevel,bool resolve_large_clauses,bool *failed_ptr,
          uint max_trail)

{
  Clause *pCVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  Clause *c;
  long lVar4;
  uint uVar5;
  long lVar6;
  
  uVar3 = (ulong)(uint)-uip;
  if (0 < uip) {
    uVar3 = (ulong)(uint)uip;
  }
  pCVar1 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
           super__Vector_impl_data._M_start[uVar3].reason;
  iVar2 = pCVar1->size;
  lVar4 = (long)iVar2;
  if ((int)CONCAT71(in_register_00000009,resolve_large_clauses) == 0) {
    uVar5 = 0;
    if (iVar2 != 2) {
LAB_00682620:
      *failed_ptr = true;
      return uVar5;
    }
    lVar4 = 2;
  }
  lVar6 = 0;
  uVar5 = 0;
  do {
    if (lVar4 * 4 == lVar6) {
      return uVar5;
    }
    iVar2 = *(int *)((long)&pCVar1[1].field_0 + lVar6);
    if (iVar2 != uip) {
      iVar2 = shrink_literal(this,iVar2,blevel,max_trail);
      if (iVar2 < 0) goto LAB_00682620;
      uVar5 = (uVar5 + 1) - (uint)(iVar2 == 0);
    }
    lVar6 = lVar6 + 4;
  } while( true );
}

Assistant:

unsigned inline Internal::shrink_along_reason (int uip, int blevel,
                                               bool resolve_large_clauses,
                                               bool &failed_ptr,
                                               unsigned max_trail) {
  LOG ("shrinking along the reason of lit %i", uip);
  unsigned open = 0;
#ifndef NDEBUG
  const Flags &f = flags (uip);
#endif
  const Var &v = var (uip);

  assert (f.shrinkable);
  assert (v.level == blevel);
  assert (v.reason);

  if (resolve_large_clauses || v.reason->size == 2) {
    const Clause &c = *v.reason;
    LOG (v.reason, "resolving with reason");
    for (int lit : c) {
      if (lit == uip)
        continue;
      assert (val (lit) < 0);
      int tmp = shrink_literal (lit, blevel, max_trail);
      if (tmp < 0) {
        failed_ptr = true;
        break;
      }
      if (tmp > 0) {
        ++open;
      }
    }
  } else {
    failed_ptr = true;
  }
  return open;
}